

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node)

{
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *pack;
  REF_INT nnode;
  REF_INT node;
  REF_NODE ref_node_local;
  
  if (ref_node->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
           "ref_node_rebuild_sorted_global","malloc pack of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node->n << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x1f6,
             "ref_node_rebuild_sorted_global","malloc pack of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      pack._0_4_ = 0;
      for (pack._4_4_ = 0; pack._4_4_ < ref_node->max; pack._4_4_ = pack._4_4_ + 1) {
        if (((-1 < pack._4_4_) && (pack._4_4_ < ref_node->max)) &&
           (-1 < ref_node->global[pack._4_4_])) {
          ref_node->sorted_global[(int)pack] = ref_node->global[pack._4_4_];
          *(int *)((long)__ptr + (long)(int)pack * 4) = pack._4_4_;
          pack._0_4_ = (int)pack + 1;
        }
      }
      ref_node_local._4_4_ =
           ref_sort_heap_glob(ref_node->n,ref_node->sorted_global,ref_node->sorted_local);
      if (ref_node_local._4_4_ == 0) {
        for (pack._4_4_ = 0; pack._4_4_ < ref_node->n; pack._4_4_ = pack._4_4_ + 1) {
          ref_node->sorted_local[pack._4_4_] =
               *(REF_INT *)((long)__ptr + (long)ref_node->sorted_local[pack._4_4_] * 4);
          ref_node->sorted_global[pack._4_4_] = ref_node->global[ref_node->sorted_local[pack._4_4_]]
          ;
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_node_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x201,"ref_node_rebuild_sorted_global",(ulong)ref_node_local._4_4_,"heap");
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_rebuild_sorted_global(REF_NODE ref_node) {
  REF_INT node, nnode, *pack;

  ref_malloc(pack, ref_node_n(ref_node), REF_INT);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    ref_node->sorted_global[nnode] = ref_node->global[node];
    pack[nnode] = node;
    nnode++;
  }

  RSS(ref_sort_heap_glob(ref_node_n(ref_node), ref_node->sorted_global,
                         ref_node->sorted_local),
      "heap");

  for (node = 0; node < ref_node_n(ref_node); node++) {
    ref_node->sorted_local[node] = pack[ref_node->sorted_local[node]];
    ref_node->sorted_global[node] =
        ref_node->global[ref_node->sorted_local[node]];
  }

  ref_free(pack);
  return REF_SUCCESS;
}